

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printDo(JSPrinter *this,Ref node)

{
  undefined8 *puVar1;
  Value *local_20;
  Ref node_local;
  
  local_20 = node.inst;
  emit(this,"do");
  safeSpace(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1,"{}");
  space(this);
  emit(this,"while");
  space(this);
  emit(this,'(');
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&local_20);
  print(this,(Value *)*puVar1);
  emit(this,')');
  return;
}

Assistant:

void printDo(Ref node) {
    emit("do");
    safeSpace();
    print(node[2], "{}");
    space();
    emit("while");
    space();
    emit('(');
    print(node[1]);
    emit(')');
  }